

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O2

JL_STATUS JlUnmarshallToStructEx
                    (JlDataObject *DictionaryObject,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,void *Structure
                    ,size_t *pErrorAtPos)

{
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  
  if ((Structure == (void *)0x0 || StructDescriptionCount == 0) ||
      (StructDescription == (JlMarshallElement *)0x0 || DictionaryObject == (JlDataObject *)0x0)) {
    JVar2 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    if (pErrorAtPos != (size_t *)0x0) {
      *pErrorAtPos = 0;
    }
    JVar1 = JlGetObjectType(DictionaryObject);
    if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
      JVar2 = UnmarshallDictionary
                        (DictionaryObject,StructDescription,StructDescriptionCount,
                         IgnoreExistingValuesInStruct,Structure,pErrorAtPos);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JL_STATUS_SUCCESS;
      }
      else {
        JlUnmarshallFreeStructAllocs(StructDescription,StructDescriptionCount,Structure);
      }
    }
    else {
      JVar2 = JL_STATUS_WRONG_TYPE;
    }
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlUnmarshallToStructEx
    (
        JlDataObject const*         DictionaryObject,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Structure,
        size_t*                     pErrorAtPos                         // OPTIONAL
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = 0;
        }

        if( JL_DATA_TYPE_DICTIONARY == JlGetObjectType( DictionaryObject ) )
        {
            jlStatus = UnmarshallDictionary(
                DictionaryObject,
                StructDescription, StructDescriptionCount,
                IgnoreExistingValuesInStruct,
                Structure,
                pErrorAtPos );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                // Deallocate items we may have allocated before the error occurred. Note this will also deallocate any
                // items that were in the structure before hand, however the structure is not guaranteed to be preserved from
                // original at this point anyway because other items may have been overwritten already.
                (void) JlUnmarshallFreeStructAllocs( StructDescription, StructDescriptionCount, Structure );
            }
        }
        else
        {
            // Root object must be a dictionary
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}